

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RenameField
          (DuckTableEntry *this,ClientContext *context,RenameFieldInfo *info)

{
  AlterInfo *this_00;
  idx_t *this_01;
  bool bVar1;
  reference pvVar2;
  ColumnDefinition *this_02;
  LogicalType *type;
  CatalogException *this_03;
  AlterInfo *in_RCX;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2e0;
  ParsedExpression *local_2d8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2d0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  LogicalType local_2b0;
  LogicalType local_298;
  ChangeColumnTypeInfo change_column_type;
  LogicalType local_1c8;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  DroppedFieldMapping res;
  AlterEntryData local_98;
  
  this_00 = in_RCX + 1;
  pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)this_00,0);
  this_01 = &(context->config).asof_loop_join_threshold;
  bVar1 = ColumnList::ColumnExists((ColumnList *)this_01,pvVar2);
  if (!bVar1) {
    this_03 = (CatalogException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&res,"Cannot rename field from column \"%s\" - it does not exist",
               (allocator *)&change_column_type);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)this_00,0);
    ::std::__cxx11::string::string((string *)&local_190,(string *)pvVar2);
    CatalogException::CatalogException<std::__cxx11::string>(this_03,(string *)&res,&local_190);
    __cxa_throw(this_03,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)this_00,0);
  this_02 = ColumnList::GetColumn((ColumnList *)this_01,pvVar2);
  type = ColumnDefinition::Type(this_02);
  RenameFieldFromStruct
            (&res,type,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)this_00,(string *)&in_RCX[1].catalog._M_string_length,1);
  if (res.error.initialized != true) {
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)this_00,0);
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&local_2e0,pvVar2);
    change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)local_2e0._M_head_impl;
    local_2e0._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&change_column_type);
    if (change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo !=
        (_func_int **)0x0) {
      (**(code **)(*change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo.
                    _vptr_ParseInfo + 8))();
    }
    change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)0x0;
    if (local_2e0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    LogicalType::LogicalType(&local_298,&res.new_type);
    Value::Value((Value *)&change_column_type,&local_298);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>
              ((duckdb *)&local_2d8,(Value *)&change_column_type);
    local_2e0._M_head_impl = local_2d8;
    local_2d8 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2e0);
    if (local_2e0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2e0._M_head_impl = (ParsedExpression *)0x0;
    if (local_2d8 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_2d8 + 8))();
    }
    local_2d8 = (ParsedExpression *)0x0;
    Value::~Value((Value *)&change_column_type);
    LogicalType::~LogicalType(&local_298);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_2e0,&res.mapping);
    change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)local_2e0._M_head_impl;
    local_2e0._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&change_column_type);
    if (change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo !=
        (_func_int **)0x0) {
      (**(code **)(*change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo.
                    _vptr_ParseInfo + 8))();
    }
    change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)0x0;
    if (local_2e0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    LogicalType::LogicalType(&local_2b0,SQLNULL);
    Value::Value((Value *)&change_column_type,&local_2b0);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>
              ((duckdb *)&local_2d8,(Value *)&change_column_type);
    local_2e0._M_head_impl = local_2d8;
    local_2d8 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2e0);
    if (local_2e0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2e0._M_head_impl = (ParsedExpression *)0x0;
    if (local_2d8 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_2d8 + 8))();
    }
    local_2d8 = (ParsedExpression *)0x0;
    Value::~Value((Value *)&change_column_type);
    LogicalType::~LogicalType(&local_2b0);
    make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_2e0,(char (*) [13])"remap_struct",&children);
    AlterInfo::GetAlterEntryData(&local_98,in_RCX);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)this_00,0);
    ::std::__cxx11::string::string((string *)&local_1b0,(string *)pvVar2);
    LogicalType::LogicalType(&local_1c8,&res.new_type);
    local_2d0._M_head_impl = local_2e0._M_head_impl;
    local_2e0._M_head_impl = (ParsedExpression *)0x0;
    ChangeColumnTypeInfo::ChangeColumnTypeInfo
              (&change_column_type,&local_98,&local_1b0,&local_1c8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_2d0);
    if (local_2d0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_2d0._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType(&local_1c8);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    AlterEntryData::~AlterEntryData(&local_98);
    ChangeColumnType(this,context,(ChangeColumnTypeInfo *)info);
    ChangeColumnTypeInfo::~ChangeColumnTypeInfo(&change_column_type);
    if (local_2e0._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    DroppedFieldMapping::~DroppedFieldMapping(&res);
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
  }
  ::std::__cxx11::string::string
            ((string *)&change_column_type,anon_var_dwarf_4b71df5 + 9,(allocator *)&children);
  ErrorData::Throw(&res.error,(string *)&change_column_type);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RenameField(ClientContext &context, RenameFieldInfo &info) {
	if (!ColumnExists(info.column_path[0])) {
		throw CatalogException("Cannot rename field from column \"%s\" - it does not exist", info.column_path[0]);
	}
	// follow the path
	auto &col = GetColumn(info.column_path[0]);
	auto res = RenameFieldFromStruct(col.Type(), info.column_path, info.new_name, 1);
	if (res.error.HasError()) {
		res.error.Throw();
		return nullptr;
	}

	// construct the struct remapping expression
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ColumnRefExpression>(info.column_path[0]));
	children.push_back(make_uniq<ConstantExpression>(Value(res.new_type)));
	children.push_back(make_uniq<ConstantExpression>(std::move(res.mapping)));
	children.push_back(make_uniq<ConstantExpression>(Value()));

	auto function = make_uniq<FunctionExpression>("remap_struct", std::move(children));

	ChangeColumnTypeInfo change_column_type(info.GetAlterEntryData(), info.column_path[0], std::move(res.new_type),
	                                        std::move(function));
	return ChangeColumnType(context, change_column_type);
}